

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall pbrt::ParameterDictionary::remove(ParameterDictionary *this,char *__filename)

{
  __type _Var1;
  bool bVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *unaff_retaddr;
  iterator iter;
  char *in_stack_ffffffffffffffc8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_20;
  
  local_20 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                ::begin(&this->params);
  do {
    __lhs = local_20;
    pIVar3 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                ::end(local_20);
    if (__lhs == pIVar3) {
LAB_007e955f:
      return (int)__lhs;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __filename,in_RDX);
    if ((_Var1) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,in_stack_ffffffffffffffc8), bVar2)) {
      __lhs = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               *)InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::erase(unaff_retaddr,(const_iterator)this);
      goto LAB_007e955f;
    }
    local_20 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)&local_20->ptr;
  } while( true );
}

Assistant:

void ParameterDictionary::remove(const std::string &name, const char *typeName) {
    for (auto iter = params.begin(); iter != params.end(); ++iter)
        if ((*iter)->name == name && (*iter)->type == typeName) {
            params.erase(iter);
            return;
        }
}